

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

int_t flexfloat_rounding_value(flexfloat_t *a,int_fast16_t exp,_Bool sign)

{
  undefined1 in_DL;
  long in_RSI;
  ulong *in_RDI;
  uint_t in_stack_ffffffffffffffd8;
  undefined5 in_stack_ffffffffffffffe0;
  _Bool in_stack_ffffffffffffffe5;
  undefined1 in_stack_ffffffffffffffe6;
  _Bool sign_00;
  flexfloat_desc_t desc;
  undefined8 local_8;
  
  if ((*in_RDI >> 0x34 & 0x7ff) == 0) {
    local_8 = flexfloat_denorm_pack
                        ((flexfloat_desc_t)(CONCAT11(in_DL,in_stack_ffffffffffffffe6) & 0x1ff),
                         in_stack_ffffffffffffffe5,in_stack_ffffffffffffffd8);
  }
  else {
    sign_00 = SUB81((ulong)in_RDI >> 0x28,0);
    desc = SUB82((ulong)in_RDI >> 0x30,0);
    if (in_RSI < 1) {
      local_8 = flexfloat_pack(desc,sign_00,in_RSI,
                               CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffe6,
                                                       CONCAT15(in_stack_ffffffffffffffe5,
                                                                in_stack_ffffffffffffffe0))) &
                               0x1ffffffffffffff);
    }
    else {
      local_8 = flexfloat_pack(desc,sign_00,in_RSI,
                               CONCAT17(in_DL,CONCAT16(in_stack_ffffffffffffffe6,
                                                       CONCAT15(in_stack_ffffffffffffffe5,
                                                                in_stack_ffffffffffffffe0))) &
                               0x1ffffffffffffff);
    }
  }
  return local_8;
}

Assistant:

int_t flexfloat_rounding_value(const flexfloat_t *a, int_fast16_t exp, bool sign)
{
    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format
    {
        return flexfloat_denorm_pack(a->desc, sign, 0x1);
    }
    else if(exp <= 0) // Denorm target format
    {
        return flexfloat_pack(a->desc, sign, - a->desc.frac_bits + 1 , 0);
    }
    else
    {
        return flexfloat_pack(a->desc, sign, exp - a->desc.frac_bits , 0);
    }

}